

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20>::Resize
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20> *this,int64_t newsize
          )

{
  undefined1 auVar1 [16];
  ostream *this_00;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar6;
  long in_RSI;
  TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20> *in_RDI;
  ulong uVar7;
  int64_t i_1;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *newstore;
  int64_t realsize;
  int64_t i;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *in_stack_ffffffffffffff20;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *this_01;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *in_stack_ffffffffffffff28;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar8;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *in_stack_ffffffffffffff30;
  TPZReference *pTVar9;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *local_98;
  long local_40;
  long local_18;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                     fNElements) {
    if ((in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc < in_RSI)
    {
      if (in_RSI < 0x15) {
        if ((in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore !=
            in_RDI->fExtAlloc) {
          for (local_18 = 0;
              local_18 <
              (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements;
              local_18 = local_18 + 1) {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
          }
          pTVar6 = (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore
          ;
          if (pTVar6 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0) {
            pTVar9 = pTVar6[-1].fRef;
            for (pTVar2 = pTVar6 + (long)pTVar9; pTVar6 != pTVar2; pTVar2 = pTVar2 + -1) {
              TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                        (in_stack_ffffffffffffff20);
            }
            operator_delete__(pTVar6 + -1,(long)pTVar9 * 8 + 8);
          }
          (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore =
               in_RDI->fExtAlloc;
        }
        (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
             in_RSI;
        (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = 0;
      }
      else {
        uVar3 = ExpandSize(in_RDI,in_RSI);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar3;
        uVar4 = SUB168(auVar1 * ZEXT816(8),0);
        uVar7 = uVar4 + 8;
        if (SUB168(auVar1 * ZEXT816(8),8) != 0 || 0xfffffffffffffff7 < uVar4) {
          uVar7 = 0xffffffffffffffff;
        }
        puVar5 = (ulong *)operator_new__(uVar7);
        *puVar5 = uVar3;
        pTVar6 = (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(puVar5 + 1);
        if (uVar3 != 0) {
          local_98 = pTVar6;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::TPZAutoPointer
                      (in_stack_ffffffffffffff30);
            local_98 = local_98 + 1;
          } while (local_98 != pTVar6 + uVar3);
        }
        for (local_40 = 0;
            local_40 <
            (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements;
            local_40 = local_40 + 1) {
          TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        }
        if (((in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore !=
             in_RDI->fExtAlloc) &&
           (pTVar2 = (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                     fStore, pTVar2 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0)) {
          pTVar8 = pTVar2 + -1;
          pTVar9 = pTVar2[-1].fRef;
          this_01 = pTVar2 + (long)pTVar9;
          while (pTVar2 != this_01) {
            this_01 = this_01 + -1;
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer(this_01);
          }
          operator_delete__(pTVar8,(long)pTVar9 * 8 + 8);
        }
        (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore = pTVar6;
        (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
             in_RSI;
        (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = uVar3;
      }
    }
    else {
      (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements = in_RSI
      ;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}